

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O3

void __thiscall duckdb::TaskScheduler::~TaskScheduler(TaskScheduler *this)

{
  _Head_base<0UL,_duckdb::ConcurrentQueue_*,_false> this_00;
  
  RelaunchThreadsInternal(this,0);
  ::std::
  vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
  ::~vector(&(this->markers).
             super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
           );
  ::std::
  vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
  ::~vector(&(this->threads).
             super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           );
  this_00._M_head_impl =
       (this->queue).
       super_unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ConcurrentQueue_*,_std::default_delete<duckdb::ConcurrentQueue>_>
       .super__Head_base<0UL,_duckdb::ConcurrentQueue_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (ConcurrentQueue *)0x0) {
    sem_destroy((sem_t *)((long)&(this_00._M_head_impl)->semaphore + 8));
    duckdb_moodycamel::
    ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
    ::~ConcurrentQueue(&(this_00._M_head_impl)->q);
    operator_delete(this_00._M_head_impl);
  }
  (this->queue).
  super_unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConcurrentQueue_*,_std::default_delete<duckdb::ConcurrentQueue>_>.
  super__Head_base<0UL,_duckdb::ConcurrentQueue_*,_false>._M_head_impl = (ConcurrentQueue *)0x0;
  return;
}

Assistant:

TaskScheduler::~TaskScheduler() {
#ifndef DUCKDB_NO_THREADS
	try {
		RelaunchThreadsInternal(0);
	} catch (...) {
		// nothing we can do in the destructor if this fails
	}
#endif
}